

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmSinglePixelSwapHsv.cpp
# Opt level: O0

QString * __thiscall
AlgorithmSinglePixelSwapHsv::GetDescription
          (QString *__return_storage_ptr__,AlgorithmSinglePixelSwapHsv *this)

{
  AlgorithmSinglePixelSwapHsv *this_local;
  
  QString::QString(__return_storage_ptr__,
                   "<p>Randomly chooses two pixels, and swaps them if the total colour error would be less.</p><p>First, the colour of each pixel is converted to the HSV colourspace, then the pixels are compared against the target imageto calculate the error, i.e. the difference in HSV values between the rgb image and the target image.</p><p>The error calculation can take advantage of the HSV colour representation and a quirk of human vision, we are more perceptive at luminosity (light/dark) differences than hue (colour) differences. Therefore when calculating error, luminosity error is considered more important than colour error</p>"
                  );
  return __return_storage_ptr__;
}

Assistant:

QString AlgorithmSinglePixelSwapHsv::GetDescription()
{
    return "<p>Randomly chooses two pixels, and swaps them if the total colour "
           "error would be less.</p>"
           "<p>First, the colour of each pixel is converted to the HSV "
           "colourspace, then the pixels are compared against the target image"
           "to calculate the error, i.e. the difference in HSV values between "
           "the rgb image and the target image.</p>"
           "<p>The error calculation can take advantage of the HSV colour "
           "representation and a quirk of human vision, we are more perceptive "
           "at luminosity (light/dark) differences than hue (colour) "
           "differences. Therefore when calculating error, luminosity error is "
           "considered more important than colour error</p>";
}